

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void StartupNotify(ArgsManager *args)

{
  long lVar1;
  bool bVar2;
  string *in_RDI;
  long in_FS_OFFSET;
  thread t;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff78;
  ArgsManager *in_stack_ffffffffffffff88;
  thread *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
             (allocator<char> *)in_stack_ffffffffffffff88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
             (allocator<char> *)in_stack_ffffffffffffff88);
  ArgsManager::GetArg(in_stack_ffffffffffffff88,in_RDI,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff96);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_ffffffffffffff48);
  if (!bVar2) {
    std::thread::thread<void(&)(std::__cxx11::string_const&),std::__cxx11::string&,void>
              (in_stack_ffffffffffffff90,
               (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
               in_stack_ffffffffffffff88,in_RDI);
    std::thread::detach();
    std::thread::~thread((thread *)in_stack_ffffffffffffff48);
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void StartupNotify(const ArgsManager& args)
{
    std::string cmd = args.GetArg("-startupnotify", "");
    if (!cmd.empty()) {
        std::thread t(runCommand, cmd);
        t.detach(); // thread runs free
    }
}